

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  bool bVar1;
  cmake *pcVar2;
  char *pcVar3;
  cmGeneratedFileStream *this_00;
  ostream *poVar4;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string sourceFileName;
  string buildFilePath;
  allocator local_41;
  undefined1 local_40 [8];
  string buildFileDir;
  string *sourceFile_local;
  string *commandLine_local;
  cmGlobalNinjaGenerator *this_local;
  
  buildFileDir.field_2._8_8_ = sourceFile;
  pcVar2 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  pcVar3 = cmake::GetHomeOutputDirectory(pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar3,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (this->CompileCommandsStream == (cmGeneratedFileStream *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sourceFileName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "/compile_commands.json");
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,pcVar3,false);
    this->CompileCommandsStream = this_00;
    std::operator<<((ostream *)this->CompileCommandsStream,"[");
    std::__cxx11::string::~string((string *)(sourceFileName.field_2._M_local_buf + 8));
  }
  else {
    poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,",");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string((string *)local_98,(string *)buildFileDir.field_2._8_8_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
  if (!bVar1) {
    pcVar2 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    pcVar3 = cmake::GetHomeOutputDirectory(pcVar2);
    cmsys::SystemTools::CollapseFullPath(&local_b8,(string *)local_98,pcVar3);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,"\n{\n");
  poVar4 = std::operator<<(poVar4,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_d8,(string *)local_40);
  poVar4 = std::operator<<(poVar4,(string *)&local_d8);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_f8,commandLine);
  poVar4 = std::operator<<(poVar4,(string *)&local_f8);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_118,(string *)local_98);
  poVar4 = std::operator<<(poVar4,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,"\"\n");
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
                                      const std::string &commandLine,
                                      const std::string &sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream)
    {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      new cmGeneratedFileStream(buildFilePath.c_str());
    *this->CompileCommandsStream << "[";
    } else {
    *this->CompileCommandsStream << "," << std::endl;
    }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str()))
    {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName,
      this->GetCMakeInstance()->GetHomeOutputDirectory());
    }


  *this->CompileCommandsStream << "\n{\n"
     << "  \"directory\": \""
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << "  \"command\": \""
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << "  \"file\": \""
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
}